

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.h
# Opt level: O0

void __thiscall Threadpool::~Threadpool(Threadpool *this)

{
  bool bVar1;
  reference this_00;
  thread *thread;
  iterator __end1;
  iterator __begin1;
  vector<std::thread,_std::allocator<std::thread>_> *__range1;
  Threadpool *this_local;
  
  std::atomic<bool>::operator=(&this->tp_run,false);
  std::condition_variable::notify_all();
  __end1 = std::vector<std::thread,_std::allocator<std::thread>_>::begin(&this->tp_pool);
  thread = (thread *)std::vector<std::thread,_std::allocator<std::thread>_>::end(&this->tp_pool);
  while (bVar1 = __gnu_cxx::
                 operator==<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                           (&__end1,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                     *)&thread), ((bVar1 ^ 0xffU) & 1) != 0) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
              ::operator*(&__end1);
    bVar1 = std::thread::joinable(this_00);
    if (bVar1) {
      std::thread::join();
    }
    __gnu_cxx::
    __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
    operator++(&__end1);
  }
  std::condition_variable::~condition_variable(&this->tp_task_cv);
  std::
  queue<std::function<void_()>,_std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>_>
  ::~queue(&this->tp_tasks);
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&this->tp_pool);
  return;
}

Assistant:

inline ~Threadpool()
	{
		tp_run=false;
		tp_task_cv.notify_all();
		for (thread& thread : tp_pool) {
			if(thread.joinable())
				thread.join(); 
		}
	}